

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O3

int64_t TPZChangeEl::NearestNode(TPZGeoMesh *gmesh,TPZVec<double> *x,double tol)

{
  long lVar1;
  TPZGeoNode *this;
  ostream *poVar2;
  int c;
  long lVar3;
  long nelem;
  double dVar4;
  double dVar5;
  TPZVec<double> nodeCoord;
  TPZVec<double> local_48;
  
  TPZVec<double>::TPZVec(&local_48,3);
  lVar1 = (gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  if (0 < lVar1) {
    nelem = 0;
    do {
      this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      TPZGeoNode::GetCoordinates(this,&local_48);
      dVar4 = 0.0;
      lVar3 = 0;
      do {
        dVar5 = x->fStore[lVar3] - local_48.fStore[lVar3];
        dVar4 = dVar4 + dVar5 * dVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar4 <= tol) {
        if ((int)nelem != -1) {
          local_48._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_48.fStore != (double *)0x0) {
            operator_delete__(local_48.fStore);
          }
          return (long)(int)nelem;
        }
        break;
      }
      nelem = nelem + 1;
    } while (nelem != lVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Node not found for coordinates ( ",0x21);
  poVar2 = std::ostream::_M_insert<double>(*x->fStore);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," , ",3);
  poVar2 = std::ostream::_M_insert<double>(x->fStore[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," , ",3);
  poVar2 = std::ostream::_M_insert<double>(x->fStore[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," )",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"See ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "static int64_t TPZChangeEl::NearestNode(TPZGeoMesh *, TPZVec<REAL> &, double)",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzchangeel.cpp"
             ,0x206);
}

Assistant:

int64_t TPZChangeEl::NearestNode(TPZGeoMesh * gmesh, TPZVec<REAL> &x, double tol)
{
	int meshNode = -1;
	
	TPZVec<REAL> nodeCoord(3);
	int64_t nnodes = gmesh->NNodes();
	
	for(int64_t n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gmesh->NodeVec()[n].GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = n;
			break;
		}
	}
	
	if(meshNode == -1)
	{
		std::cout << "Node not found for coordinates ( " << x[0] << " , " << x[1] << " , " << x[2] << " )" << std::endl;
		std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
		
		DebugStop();
	}
	
	return meshNode;
}